

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  *(undefined ***)&this->field_0x190 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x198 = 0;
  *(char **)&this->field_0x1a0 = "IfcStructuralSurfaceMemberVarying";
  IfcStructuralSurfaceMember::IfcStructuralSurfaceMember
            (&this->super_IfcStructuralSurfaceMember,&PTR_construction_vtable_24__00861db8);
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x168 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x861c60;
  *(undefined8 *)&this->field_0x190 = 0x861da0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x861c88;
  (this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x861cb0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x861cd8;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = 0x861d00;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0x861d28;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0x861d50;
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x160 = 0x861d78;
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x170 = 0;
  *(undefined8 *)&this->field_0x178 = 0;
  *(undefined8 *)&this->field_0x180 = 0;
  (this->VaryingThicknessLocation).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}